

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void anon_unknown.dwarf_590f::InitializeAperiodicity
               (int f0_length,int fft_size,double **aperiodicity)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  double **aperiodicity_local;
  int fft_size_local;
  int f0_length_local;
  
  for (local_1c = 0; local_1c < f0_length; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < fft_size / 2 + 1; local_20 = local_20 + 1) {
      aperiodicity[local_1c][local_20] = 0.999999999999;
    }
  }
  return;
}

Assistant:

static void InitializeAperiodicity(int f0_length, int fft_size,
    double **aperiodicity) {
  for (int i = 0; i < f0_length; ++i)
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      aperiodicity[i][j] = 1.0 - world::kMySafeGuardMinimum;
}